

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_mysql.cpp
# Opt level: O0

bool setOptionInt(MYSQL *mysql,mysql_option option,QStringView v)

{
  int iVar1;
  undefined4 in_ESI;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  bool bVar2;
  int val;
  bool bOk;
  int in_stack_ffffffffffffffcc;
  undefined2 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  int local_20;
  byte local_19;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_19 = 0xaa;
  local_20 = QStringView::toInt(in_RDI,(bool *)CONCAT44(in_ESI,CONCAT13(in_stack_ffffffffffffffd3,
                                                                        CONCAT12(
                                                  in_stack_ffffffffffffffd2,
                                                  in_stack_ffffffffffffffd0))),
                                in_stack_ffffffffffffffcc);
  if ((local_19 & 1) == 0) {
    bVar2 = false;
  }
  else {
    iVar1 = mysql_options(in_RDI,in_ESI,&local_20);
    bVar2 = iVar1 == 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool setOptionInt(MYSQL *mysql, mysql_option option, QStringView v)
{
    bool bOk;
    const auto val = v.toInt(&bOk);
    return bOk ? mysql_options(mysql, option, &val) == 0 : false;
}